

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O2

void copy<unsigned_char*,16u,unsigned_char**>(vector_bagwell<unsigned_char_*,_16U> *v,uchar **dst)

{
  pointer pppuVar1;
  pointer pppuVar2;
  uchar **__src;
  size_t __n;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  uVar4 = 1;
  lVar3 = 0x10;
  while( true ) {
    pppuVar1 = (v->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_start;
    pppuVar2 = (v->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if ((ulong)((long)pppuVar2 - (long)pppuVar1 >> 3) <= uVar4) break;
    if (lVar3 != 0) {
      memmove(dst,pppuVar1[uVar4 - 1],lVar3 * 8);
    }
    dst = dst + lVar3;
    lVar3 = lVar3 * 2;
    uVar4 = uVar4 + 1;
  }
  __src = pppuVar2[-1];
  __n = (long)v->_insertpos - (long)__src;
  if (__n != 0) {
    memmove(dst,__src,__n);
    return;
  }
  return;
}

Assistant:

static inline void
copy(const vector_bagwell<T, InitialSize>& v, OutputIterator dst)
{
	size_t bufsize = InitialSize;
	for (size_t i=1; i < v._index_block.size(); ++i) {
		std::copy(v._index_block[i-1],
		          v._index_block[i-1]+bufsize,
		          dst);
		dst += bufsize;
		bufsize *= 2;
	}
	std::copy(v._index_block.back(), v._insertpos, dst);
}